

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall skiwi::anon_unknown_23::foreign_call_9::~foreign_call_9(foreign_call_9 *this)

{
  foreign_call_9 *this_local;
  
  ~foreign_call_9(this);
  operator_delete(this,0x298);
  return;
}

Assistant:

void test()
      {
      external_function ef;
      ef.name = "is_even";
      ef.address = (uint64_t)&is_even;
      ef.return_type = external_function::T_BOOL;
      ef.arguments.push_back(external_function::T_INT64);
      externals[ef.name] = ef;
      TEST_EQ("#f", run("(foreign-call is_even 1)"));
      TEST_EQ("#t", run("(foreign-call is_even 2)"));
      TEST_EQ("#f", run("(foreign-call is_even 3)"));
      TEST_EQ("#t", run("(foreign-call is_even 4)"));
      }